

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUnitTest.h
# Opt level: O3

void Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<Centaurus::CharClass<char>>
               (CharClass<char> *expected,CharClass<char> *actual,wchar_t *message)

{
  bool bVar1;
  wostream *pwVar2;
  size_t sVar3;
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> local_a8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  undefined **local_50;
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> local_48;
  
  bVar1 = Centaurus::CharClass<char>::operator==(expected,actual);
  if (bVar1) {
    return;
  }
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            ((wostream *)&std::wcerr,L"Assert failed. Expected:",0x18);
  local_50 = &PTR__CharClass_001c49c0;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::vector
            (&local_48,&expected->m_ranges);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_70,vswprintf,0x10,L"%d",
             (ulong)(local_48.
                     super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                    local_48.
                    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish));
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)&std::wcerr,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" Actual:",8);
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::vector
            (&local_a8,&actual->m_ranges);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_90,vswprintf,0x10,L"%d",
             (ulong)(local_a8.
                     super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                    local_a8.
                    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish));
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_50 = &PTR__CharClass_001c49c0;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector(&local_48);
  if (message != (wchar_t *)0x0) {
    sVar3 = wcslen(message);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcerr,message,sVar3);
    std::endl<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcerr);
  }
  exit(1);
}

Assistant:

static void AreEqual(const T& expected, const T& actual, const wchar_t *message = NULL)
    {
        if (!Equals(expected, actual))
        {
            std::wcerr << L"Assert failed. Expected:" << ToString(expected) << L" Actual:" << ToString(actual) << std::endl;
            if (message != NULL)
                std::wcerr << message << std::endl;
            exit(EXIT_FAILURE);
        }
    }